

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Bitmask whereOmitNoopJoin(WhereInfo *pWInfo,Bitmask notReady)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  WhereLoop *pWVar4;
  SrcList *pSVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  Bitmask BVar9;
  Bitmask BVar10;
  WhereTerm *pWVar11;
  WhereTerm *pWVar12;
  WhereTerm *pWVar13;
  ulong uVar14;
  
  BVar9 = sqlite3WhereExprListUsage(&pWInfo->sMaskSet,pWInfo->pResultSet);
  if (pWInfo->pOrderBy != (ExprList *)0x0) {
    BVar10 = sqlite3WhereExprListUsage(&pWInfo->sMaskSet,pWInfo->pOrderBy);
    BVar9 = BVar9 | BVar10;
  }
  BVar10 = 0xffffffffffffffff;
  if (1 < (ulong)pWInfo->nLevel) {
    bVar1 = pWInfo->pTabList->a[0].fg.jointype;
    BVar10 = 0xffffffffffffffff;
    uVar14 = (ulong)pWInfo->nLevel;
    do {
      pWVar4 = pWInfo->a[uVar14 - 1].pWLoop;
      pSVar5 = pWInfo->pTabList;
      bVar2 = pWVar4->iTab;
      if (((pSVar5->a[bVar2].fg.jointype & 0x18) == 8) &&
         ((((pWInfo->wctrlFlags & 0x100) != 0 || ((pWVar4->wsFlags & 0x1000) != 0)) &&
          (uVar6 = pWVar4->maskSelf, (uVar6 & BVar9) == 0)))) {
        pWVar13 = (pWInfo->sWC).a;
        iVar3 = (pWInfo->sWC).nTerm;
        pWVar11 = pWVar13 + iVar3;
        pWVar12 = pWVar13;
        if (0 < (long)iVar3) {
          do {
            if ((((pWVar12->prereqAll & uVar6) != 0) &&
                (((pWVar12->pExpr->flags & 1) == 0 ||
                 ((pWVar12->pExpr->w).iJoin != pSVar5->a[bVar2].iCursor)))) ||
               (((bVar1 & 0x40) != 0 &&
                (((pWVar12->pExpr->flags & 2) != 0 &&
                 ((pWVar12->pExpr->w).iJoin == pSVar5->a[bVar2].iCursor)))))) goto LAB_00194bbd;
            pWVar12 = pWVar12 + 1;
          } while (pWVar12 < pWVar11);
        }
        uVar7 = pWInfo->revMask;
        bVar2 = (byte)(uVar14 - 1);
        pWInfo->revMask = ((uVar7 >> 1 ^ uVar7) >> (bVar2 & 0x3f)) << (bVar2 & 0x3f) ^ uVar7;
        if (0 < iVar3) {
          do {
            if ((pWVar13->prereqAll & uVar6) != 0) {
              *(byte *)&pWVar13->wtFlags = (byte)pWVar13->wtFlags | 4;
            }
            pWVar13 = pWVar13 + 1;
          } while (pWVar13 < pWVar11);
        }
        if (uVar14 != pWInfo->nLevel) {
          memmove(pWInfo->a + (uVar14 - 1),pWInfo->a + uVar14,
                  (long)((ulong)((uint)pWInfo->nLevel - (int)uVar14) * 0x7000000000) >> 0x20);
        }
        BVar10 = BVar10 & ~uVar6;
        pWInfo->nLevel = pWInfo->nLevel + 0xff;
      }
LAB_00194bbd:
      bVar8 = 2 < (long)uVar14;
      uVar14 = uVar14 - 1;
    } while (bVar8);
  }
  return BVar10;
}

Assistant:

static SQLITE_NOINLINE Bitmask whereOmitNoopJoin(
  WhereInfo *pWInfo,
  Bitmask notReady
){
  int i;
  Bitmask tabUsed;
  int hasRightJoin;

  /* Preconditions checked by the caller */
  assert( pWInfo->nLevel>=2 );
  assert( OptimizationEnabled(pWInfo->pParse->db, SQLITE_OmitNoopJoin) );

  /* These two preconditions checked by the caller combine to guarantee
  ** condition (1) of the header comment */
  assert( pWInfo->pResultSet!=0 );
  assert( 0==(pWInfo->wctrlFlags & WHERE_AGG_DISTINCT) );

  tabUsed = sqlite3WhereExprListUsage(&pWInfo->sMaskSet, pWInfo->pResultSet);
  if( pWInfo->pOrderBy ){
    tabUsed |= sqlite3WhereExprListUsage(&pWInfo->sMaskSet, pWInfo->pOrderBy);
  }
  hasRightJoin = (pWInfo->pTabList->a[0].fg.jointype & JT_LTORJ)!=0;
  for(i=pWInfo->nLevel-1; i>=1; i--){
    WhereTerm *pTerm, *pEnd;
    SrcItem *pItem;
    WhereLoop *pLoop;
    Bitmask m1;
    pLoop = pWInfo->a[i].pWLoop;
    pItem = &pWInfo->pTabList->a[pLoop->iTab];
    if( (pItem->fg.jointype & (JT_LEFT|JT_RIGHT))!=JT_LEFT ) continue;
    if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)==0
     && (pLoop->wsFlags & WHERE_ONEROW)==0
    ){
      continue;
    }
    if( (tabUsed & pLoop->maskSelf)!=0 ) continue;
    pEnd = pWInfo->sWC.a + pWInfo->sWC.nTerm;
    for(pTerm=pWInfo->sWC.a; pTerm<pEnd; pTerm++){
      if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
        if( !ExprHasProperty(pTerm->pExpr, EP_OuterON)
         || pTerm->pExpr->w.iJoin!=pItem->iCursor
        ){
          break;
        }
      }
      if( hasRightJoin
       && ExprHasProperty(pTerm->pExpr, EP_InnerON)
       && NEVER(pTerm->pExpr->w.iJoin==pItem->iCursor)
      ){
        break;  /* restriction (5) */
      }
    }
    if( pTerm<pEnd ) continue;
    WHERETRACE(0xffffffff,("-> omit unused FROM-clause term %c\n",pLoop->cId));
    m1 = MASKBIT(i)-1;
    testcase( ((pWInfo->revMask>>1) & ~m1)!=0 );
    pWInfo->revMask = (m1 & pWInfo->revMask) | ((pWInfo->revMask>>1) & ~m1);
    notReady &= ~pLoop->maskSelf;
    for(pTerm=pWInfo->sWC.a; pTerm<pEnd; pTerm++){
      if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
        pTerm->wtFlags |= TERM_CODED;
      }
    }
    if( i!=pWInfo->nLevel-1 ){
      int nByte = (pWInfo->nLevel-1-i) * sizeof(WhereLevel);
      memmove(&pWInfo->a[i], &pWInfo->a[i+1], nByte);
    }
    pWInfo->nLevel--;
    assert( pWInfo->nLevel>0 );
  }
  return notReady;
}